

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::exception<ki::protocol::runtime_error>::exception
          (exception<ki::protocol::runtime_error> *this,handle scope,char *name,PyObject *base)

{
  exception<ki::protocol::runtime_error> *peVar1;
  int iVar2;
  handle *handle;
  undefined8 *puVar3;
  long *plVar4;
  PyObject *pPVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  string full_name;
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  exception<ki::protocol::runtime_error> *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [24];
  object local_38;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_50._16_8_ = "__name__";
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_98 = this;
  local_50._8_8_ = scope.m_ptr;
  handle = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                      ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_50)->
            super_handle;
  cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_b8,handle);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".","");
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar8 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_88 + local_b8._M_string_length) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if (local_88 + local_b8._M_string_length <= uVar9) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_0012a830;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
LAB_0012a830:
  local_d8._0_8_ = local_d8 + 0x10;
  psVar7 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar7) {
    local_d8._16_8_ = *psVar7;
    local_d8._24_8_ = puVar3[3];
  }
  else {
    local_d8._16_8_ = *psVar7;
    local_d8._0_8_ = (size_type *)*puVar3;
  }
  local_d8._8_8_ = puVar3[1];
  *puVar3 = psVar7;
  puVar3[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_d8);
  local_70 = &local_60;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  peVar1 = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  object::~object(&local_38);
  pPVar5 = (PyObject *)PyErr_NewException(local_70,base,0);
  (peVar1->super_object).super_handle.m_ptr = pPVar5;
  iVar2 = PyObject_HasAttrString(scope.m_ptr,name);
  if (iVar2 != 1) {
    local_d8._24_8_ = 0;
    local_d8._8_8_ = scope.m_ptr;
    local_d8._16_8_ = name;
    detail::accessor_policies::str_attr::set(scope,name,(peVar1->super_object).super_handle.m_ptr);
    object::~object((object *)(local_d8 + 0x18));
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    return;
  }
  std::__cxx11::string::string((string *)local_50,name,(allocator *)&local_90);
  std::operator+(&local_b8,
                 "Error during initialization: multiple incompatible definitions with name \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  local_d8._0_8_ = *puVar3;
  psVar7 = puVar3 + 2;
  if ((size_type *)local_d8._0_8_ == psVar7) {
    local_d8._16_8_ = *psVar7;
    local_d8._24_8_ = puVar3[3];
    local_d8._0_8_ = local_d8 + 0x10;
  }
  else {
    local_d8._16_8_ = *psVar7;
  }
  local_d8._8_8_ = puVar3[1];
  *puVar3 = psVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  pybind11_fail((string *)local_d8);
}

Assistant:

exception(handle scope, const char *name, PyObject *base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base, NULL);
        if (hasattr(scope, name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }